

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configuration.c
# Opt level: O0

char * get_yanglint_dir(void)

{
  FILE *pFVar1;
  __uid_t __uid;
  int iVar2;
  passwd *ppVar3;
  int *piVar4;
  char *pcVar5;
  size_t sVar6;
  char *yl_dir;
  char *user_home;
  passwd *pw;
  char *pcStack_10;
  int ret;
  
  __uid = getuid();
  ppVar3 = getpwuid(__uid);
  pFVar1 = _stderr;
  if (ppVar3 == (passwd *)0x0) {
    piVar4 = __errno_location();
    pcVar5 = strerror(*piVar4);
    fprintf(pFVar1,"Determining home directory failed (%s).\n",pcVar5);
    pcStack_10 = (char *)0x0;
  }
  else {
    pcVar5 = ppVar3->pw_dir;
    sVar6 = strlen(pcVar5);
    pcStack_10 = (char *)malloc(sVar6 + 0xb);
    pFVar1 = _stderr;
    if (pcStack_10 == (char *)0x0) {
      piVar4 = __errno_location();
      pcVar5 = strerror(*piVar4);
      fprintf(pFVar1,"Memory allocation failed (%s).\n",pcVar5);
      pcStack_10 = (char *)0x0;
    }
    else {
      sprintf(pcStack_10,"%s/%s",pcVar5,".yanglint");
      iVar2 = access(pcStack_10,5);
      if (iVar2 == -1) {
        piVar4 = __errno_location();
        pFVar1 = _stderr;
        if (*piVar4 == 2) {
          fprintf(_stdout,"Configuration directory \"%s\" does not exist, creating it.\n",pcStack_10
                 );
          iVar2 = mkdir(pcStack_10,0x1c0);
          pFVar1 = _stderr;
          if (iVar2 != 0) {
            piVar4 = __errno_location();
            pcVar5 = strerror(*piVar4);
            fprintf(pFVar1,"Configuration directory \"%s\" cannot be created (%s).\n",pcStack_10,
                    pcVar5);
            free(pcStack_10);
            pcStack_10 = (char *)0x0;
          }
        }
        else {
          piVar4 = __errno_location();
          pcVar5 = strerror(*piVar4);
          fprintf(pFVar1,"Configuration directory \"%s\" exists but cannot be accessed (%s).\n",
                  pcStack_10,pcVar5);
          free(pcStack_10);
          pcStack_10 = (char *)0x0;
        }
      }
    }
  }
  return pcStack_10;
}

Assistant:

char *
get_yanglint_dir(void)
{
    int ret;
    struct passwd *pw;
    char *user_home, *yl_dir;

    if (!(pw = getpwuid(getuid()))) {
        fprintf(stderr, "Determining home directory failed (%s).\n", strerror(errno));
        return NULL;
    }
    user_home = pw->pw_dir;

    yl_dir = malloc(strlen(user_home) + 1 + strlen(YL_DIR) + 1);
    if (!yl_dir) {
        fprintf(stderr, "Memory allocation failed (%s).\n", strerror(errno));
        return NULL;
    }
    sprintf(yl_dir, "%s/%s", user_home, YL_DIR);

    ret = access(yl_dir, R_OK | X_OK);
    if (ret == -1) {
        if (errno == ENOENT) {
            /* directory does not exist */
            fprintf(stdout, "Configuration directory \"%s\" does not exist, creating it.\n", yl_dir);
            if (mkdir(yl_dir, 00700)) {
                fprintf(stderr, "Configuration directory \"%s\" cannot be created (%s).\n", yl_dir, strerror(errno));
                free(yl_dir);
                return NULL;
            }
        } else {
            fprintf(stderr, "Configuration directory \"%s\" exists but cannot be accessed (%s).\n", yl_dir, strerror(errno));
            free(yl_dir);
            return NULL;
        }
    }

    return yl_dir;
}